

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# qpromise_p.h
# Opt level: O2

void QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<int>>::
     call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>
               (QPromise<int> *promise,QPromiseResolve<int> *resolve,QPromiseReject<int> *reject)

{
  QSharedData *pQVar1;
  bool bVar2;
  anon_class_24_2_d74e9aa7 local_58;
  Data *local_40;
  undefined **local_38;
  PromiseData<int> *local_30;
  QPromiseBase<int> local_28;
  
  bVar2 = QtPromise::QPromiseBase<int>::isFulfilled(&promise->super_QPromiseBase<int>);
  if (bVar2) {
    PromiseResolver<int>::resolve<QtPromisePrivate::PromiseValue<int>const&>
              (&resolve->m_resolver,&((promise->super_QPromiseBase<int>).m_d.d)->m_value);
    return;
  }
  bVar2 = QtPromise::QPromiseBase<int>::isRejected(&promise->super_QPromiseBase<int>);
  if (bVar2) {
    PromiseResolver<int>::reject<QtPromisePrivate::PromiseError_const&>
              (&reject->m_resolver,
               &(((promise->super_QPromiseBase<int>).m_d.d)->
                super_PromiseDataBase<int,_void_(const_int_&)>).m_error);
    return;
  }
  local_58.reject.m_resolver.m_d.d = (PromiseResolver<int>)(resolve->m_resolver).m_d.d;
  if (local_58.reject.m_resolver.m_d.d !=
      (QExplicitlySharedDataPointer<QtPromisePrivate::PromiseResolver<int>::Data>)0x0) {
    LOCK();
    (((Data *)local_58.reject.m_resolver.m_d.d)->super_QSharedData).ref.super_QAtomicInteger<int>.
    super_QBasicAtomicInteger<int>._q_value =
         (Type)((int)(((Data *)local_58.reject.m_resolver.m_d.d)->super_QSharedData).ref.
                     super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_58.promise.super_QPromiseBase<int>.m_d.d = (promise->super_QPromiseBase<int>).m_d.d;
  if (local_58.promise.super_QPromiseBase<int>.m_d.d != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &((local_58.promise.super_QPromiseBase<int>.m_d.d)->
              super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_58.promise.super_QPromiseBase<int>._vptr_QPromiseBase =
       (_func_int **)&PTR__QPromiseBase_00128bc8;
  local_40 = (reject->m_resolver).m_d.d;
  if (local_40 != (Data *)0x0) {
    LOCK();
    (local_40->super_QSharedData).ref.super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>.
    _q_value = (Type)((int)(local_40->super_QSharedData).ref.super_QAtomicInteger<int>.
                           super_QBasicAtomicInteger<int>._q_value + 1);
    UNLOCK();
  }
  local_30 = (promise->super_QPromiseBase<int>).m_d.d;
  if (local_30 != (PromiseData<int> *)0x0) {
    LOCK();
    pQVar1 = &(local_30->super_PromiseDataBase<int,_void_(const_int_&)>).super_QSharedData;
    (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
    super___atomic_base<int>._M_i =
         (pQVar1->ref).super_QAtomicInteger<int>.super_QBasicAtomicInteger<int>._q_value.
         super___atomic_base<int>._M_i + 1;
    UNLOCK();
  }
  local_38 = &PTR__QPromiseBase_00128bc8;
  QtPromise::QPromiseBase<int>::
  then<QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<int>>::call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(QtPromise::QPromise<int>const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)::_lambda()_1_,QtPromisePrivate::PromiseFulfill<QtPromise::QPromise<int>>::call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(QtPromise::QPromise<int>const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)::_lambda()_2_>
            (&local_28,(anon_class_24_2_e6a34898 *)promise,&local_58);
  QtPromise::QPromiseBase<void>::~QPromiseBase((QPromiseBase<void> *)&local_28);
  call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(QtPromise::QPromise<int>const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda()#2}::~call((_lambda___2_ *)&local_40);
  call<QtPromise::QPromiseResolve<int>,QtPromise::QPromiseReject<int>>(QtPromise::QPromise<int>const&,QtPromise::QPromiseResolve<int>const&,QtPromise::QPromiseReject<int>const&)
  ::{lambda()#1}::~call((_lambda___1_ *)&local_58);
  return;
}

Assistant:

static void
    call(const QtPromise::QPromise<T>& promise, const TResolve& resolve, const TReject& reject)
    {
        if (promise.isFulfilled()) {
            resolve(promise.m_d->value());
        } else if (promise.isRejected()) {
            reject(promise.m_d->error());
        } else {
            promise.then(
                [=]() {
                    resolve(promise.m_d->value());
                },
                [=]() { // catch all
                    reject(promise.m_d->error());
                });
        }
    }